

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O3

void __thiscall
icu_63::RuleBasedCollator::setLocales
          (RuleBasedCollator *this,Locale *requested,Locale *valid,Locale *actual)

{
  UBool UVar1;
  
  UVar1 = Locale::operator==(actual,&this->tailoring->actualLocale);
  this->actualLocaleIsSameAsValid = UVar1 == '\0';
  Locale::operator=(&this->validLocale,valid);
  return;
}

Assistant:

void
RuleBasedCollator::setLocales(const Locale &requested, const Locale &valid,
                              const Locale &actual) {
    if(actual == tailoring->actualLocale) {
        actualLocaleIsSameAsValid = FALSE;
    } else {
        U_ASSERT(actual == valid);
        actualLocaleIsSameAsValid = TRUE;
    }
    // Do not modify tailoring.actualLocale:
    // We cannot be sure that that would be thread-safe.
    validLocale = valid;
    (void)requested;  // Ignore, see also ticket #10477.
}